

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O0

void __thiscall UIContext::Detail::Render(Detail *this,ApplicationContextBase *context)

{
  bool bVar1;
  long in_RSI;
  long *in_RDI;
  ImVec4 clear_color;
  float font_scale;
  char buff [256];
  ImGuiWindowFlags flags;
  ImGuiIO *io;
  int h;
  int w;
  ImGuiWindowFlags in_stack_000004f4;
  bool *in_stack_000004f8;
  char *in_stack_00000500;
  ApplicationContextBase *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  float _x;
  int *in_stack_fffffffffffffe58;
  ImVec2 *this_00;
  GLFWwindow *in_stack_fffffffffffffe60;
  ImVec2 *this_01;
  ImColor local_16c;
  ImVec4 local_15c;
  undefined4 local_14c;
  char local_148 [152];
  ImDrawData *in_stack_ffffffffffffff50;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImGuiIO *local_20;
  int local_18;
  int local_14;
  
  if ((*in_RDI != 0) && ((*(byte *)(in_RSI + 0x18) & 1) == 0)) {
    glfwMakeContextCurrent
              ((GLFWwindow *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    ActivateContext((Detail *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    glfwGetFramebufferSize
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (int *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    local_20 = ImGui::GetIO();
    ImVec2::ImVec2(&local_28,(float)local_14,(float)local_18);
    local_20->DisplaySize = local_28;
    ImGui_ImplOpenGL3_NewFrame();
    ImGui_ImplGlfw_NewFrame();
    ImGui::NewFrame();
    this_00 = &local_30;
    _x = 0.0;
    ImVec2::ImVec2(this_00,0.0,0.0);
    this_01 = &local_38;
    ImVec2::ImVec2(this_01,_x,_x);
    ImGui::SetNextWindowPos(this_00,0,this_01);
    ImVec2::ImVec2(&local_40,(float)local_14,(float)local_18);
    ImGui::SetNextWindowSize(&local_40,0);
    sprintf(local_148,"###GraphicsWindow_%td",in_RDI);
    ImGui::Begin(in_stack_00000500,in_stack_000004f8,in_stack_000004f4);
    local_14c = 0x40000000;
    ImGui::SetWindowFontScale(_x);
    glViewport(0,0,local_14,local_18);
    ImColor::ImColor((ImColor *)this_01,(int)((ulong)this_00 >> 0x20),(int)this_00,(int)_x,
                     in_stack_fffffffffffffe50);
    local_15c = ImColor::operator_cast_to_ImVec4(&local_16c);
    glClearColor(local_15c.x,local_15c.y,local_15c.z,local_15c.w);
    glClear(0x4100);
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(ApplicationContextBase_&)> *)
                       CONCAT44(_x,in_stack_fffffffffffffe50));
    if (bVar1) {
      std::function<void_(ApplicationContextBase_&)>::operator()
                ((function<void_(ApplicationContextBase_&)> *)CONCAT44(_x,in_stack_fffffffffffffe50)
                 ,in_stack_fffffffffffffe48);
    }
    ImGui::End();
    ImGui::Render();
    ImGui::GetDrawData();
    ImGui_ImplOpenGL3_RenderDrawData(in_stack_ffffffffffffff50);
    glfwSwapBuffers((GLFWwindow *)CONCAT44(_x,in_stack_fffffffffffffe50));
  }
  return;
}

Assistant:

void Render(ApplicationContextBase& context)
    {
        if (!_window || context.join_now)
            return;

        glfwMakeContextCurrent(_window);

        ActivateContext();

        int w, h;
        glfwGetFramebufferSize(_window, &w, &h);

        auto& io = ImGui::GetIO();
        // Setup display size (every frame to accommodate for window resizing)
        io.DisplaySize = ImVec2(static_cast<float>(w), static_cast<float>(h));

        ImGui_ImplOpenGL3_NewFrame();
        ImGui_ImplGlfw_NewFrame();
        ImGui::NewFrame();

        //ImGuizmo::BeginFrame();

        // make a full screen window
        ImGui::SetNextWindowPos(ImVec2(0, 0));
        ImGui::SetNextWindowSize(ImVec2(static_cast<float>(w), static_cast<float>(h)));
        ImGuiWindowFlags flags =
            ImGuiWindowFlags_NoTitleBar
            | ImGuiWindowFlags_NoResize
            | ImGuiWindowFlags_NoMove
            | ImGuiWindowFlags_NoCollapse
            | ImGuiWindowFlags_NoBringToFrontOnFocus
            | ImGuiWindowFlags_NoFocusOnAppearing
            | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse;

        // ensure every window has a unique id
        char buff[256];
        sprintf(buff, "###GraphicsWindow_%td", (ptrdiff_t)this);
        ImGui::Begin(buff, 0, flags);

        const float font_scale = 2.0f;
        ImGui::SetWindowFontScale(font_scale);

        // Rendering
        glViewport(0, 0, w, h);

        ImVec4 clear_color = ImColor(1, 0, 0, 1);

        glClearColor(clear_color.x, clear_color.y, clear_color.z, clear_color.w);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

        if (_run) _run(context);

        ImGui::End(); // end the main window
        ImGui::Render();
        ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData());

        glfwSwapBuffers(_window);
    }